

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O3

void luaT_init(lua_State *L)

{
  GCObject *o;
  TString *pTVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    pTVar1 = luaS_new(L,(char *)((long)&luaT_init_luaT_eventname_rel +
                                (long)*(int *)((long)&luaT_init_luaT_eventname_rel + lVar2)));
    *(TString **)((long)L->l_G->tmname + lVar2 * 2) = pTVar1;
    o = *(GCObject **)((long)L->l_G->tmname + lVar2 * 2);
    if (9 < (o->tt & 0xe)) {
      __assert_fail("((((L->l_G)->tmname[i])->tt) & 0x0F) < (9+1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x32,"void luaT_init(lua_State *)");
    }
    luaC_fix(L,o);
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x60);
  return;
}

Assistant:

void luaT_init (lua_State *L) {
  static const char *const luaT_eventname[] = {  /* ORDER TM */
    "__index", "__newindex",
    "__gc", "__mode", "__len", "__eq",
    "__add", "__sub", "__mul", "__mod", "__pow",
    "__div", "__idiv",
    "__band", "__bor", "__bxor", "__shl", "__shr",
    "__unm", "__bnot", "__lt", "__le",
    "__concat", "__call"
  };
  int i;
  for (i=0; i<TM_N; i++) {
    G(L)->tmname[i] = luaS_new(L, luaT_eventname[i]);
    luaC_fix(L, obj2gco(G(L)->tmname[i]));  /* never collect these names */
  }
}